

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

int64_t __thiscall Timer::getNs(Timer *this)

{
  timespec now;
  
  now.tv_sec = 0;
  now.tv_nsec = 0;
  clock_gettime(1,(timespec *)&now);
  return (now.tv_sec - (this->_startTime).tv_sec) * 1000000000 +
         (now.tv_nsec - (this->_startTime).tv_nsec);
}

Assistant:

int64_t Timer::getNs() {
  struct timespec now = {};
#ifdef __linux__
  clock_gettime(CLOCK_MONOTONIC, &now);
#elif _WIN32
  clock_gettime_monotonic(&now);
#endif
  return (int64_t)(now.tv_nsec - _startTime.tv_nsec) +
         1000000000 * (now.tv_sec - _startTime.tv_sec);
}